

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.h
# Opt level: O0

RcImplApiService * RcImplApiService::get_instance(void)

{
  int iVar1;
  Mutex *mutex;
  undefined1 local_18 [8];
  AutoMutex auto_lock;
  
  if (get_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&get_instance()::instance);
    if (iVar1 != 0) {
      RcImplApiService(&get_instance::instance);
      __cxa_atexit(~RcImplApiService,&get_instance::instance,&__dso_handle);
      __cxa_guard_release(&get_instance()::instance);
    }
  }
  mutex = get_lock();
  Mutex::Autolock::Autolock((Autolock *)local_18,mutex,1);
  Mutex::Autolock::~Autolock((Autolock *)local_18);
  return &get_instance::instance;
}

Assistant:

static RcImplApiService *get_instance() {
        static RcImplApiService instance;
        AutoMutex auto_lock(get_lock());
        return &instance;
    }